

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

loc_conflict find_normal_to_wall(chunk_conflict *c,loc_conflict grid,_Bool inner)

{
  loc grid2;
  _Bool _Var1;
  uint32_t uVar2;
  loc grid_00;
  loc_conflict lVar3;
  ulong uVar4;
  loc_conflict choices [8];
  uint32_t local_8c;
  loc alStack_78 [9];
  
  _Var1 = square_is_granite_with_flag(c,grid,L'\f');
  if (!_Var1) {
    _Var1 = square_is_granite_with_flag(c,grid,L'\r');
    if (!_Var1) {
      __assert_fail("square_is_granite_with_flag(c, grid, SQUARE_WALL_OUTER) || square_is_granite_with_flag(c, grid, SQUARE_WALL_SOLID)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/gen-cave.c"
                    ,0x19c,"struct loc find_normal_to_wall(struct chunk *, struct loc, _Bool)");
    }
  }
  uVar4 = 0;
  local_8c = 0;
  uVar2 = 0;
  do {
    grid2 = ddgrid_ddd[uVar4];
    grid_00 = (loc)loc_sum(grid,(loc_conflict)grid2);
    _Var1 = square_in_bounds(c,grid_00);
    if (_Var1) {
      _Var1 = square_isperm(c,grid_00);
      if (!_Var1) {
        _Var1 = square_isroom(c,grid_00);
        if (_Var1 == inner) {
          _Var1 = square_is_granite_with_flag(c,(loc_conflict)grid_00,L'\f');
          if (!_Var1) {
            _Var1 = square_is_granite_with_flag(c,(loc_conflict)grid_00,L'\r');
            if (!_Var1) {
              _Var1 = square_is_granite_with_flag(c,(loc_conflict)grid_00,L'\v');
              if (!_Var1) {
                alStack_78[(int)uVar2] = grid2;
                uVar2 = uVar2 + 1;
                local_8c = local_8c + (uVar4 < 4);
              }
            }
          }
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  if ((int)local_8c < 1) {
    local_8c = uVar2;
  }
  if ((int)uVar2 < 2) {
    local_8c = uVar2;
  }
  if (local_8c != 0) {
    uVar2 = Rand_div(local_8c);
    return (loc_conflict)alStack_78[(int)uVar2];
  }
  lVar3 = loc(0,0);
  return lVar3;
}

Assistant:

static struct loc find_normal_to_wall(struct chunk *c, struct loc grid,
	bool inner)
{
	int n = 0, ncardinal = 0, i;
	struct loc choices[8];

	assert(square_is_granite_with_flag(c, grid, SQUARE_WALL_OUTER) ||
		square_is_granite_with_flag(c, grid, SQUARE_WALL_SOLID));
	/* Relies on the cardinal directions being first in ddgrid_ddd. */
	for (i = 0; i < 8; ++i) {
		struct loc chk = loc_sum(grid, ddgrid_ddd[i]);

		if (square_in_bounds(c, chk) &&
			!square_isperm(c, chk) &&
			(square_isroom(c, chk) == inner) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_OUTER) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_SOLID) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_INNER)) {
			choices[n] = ddgrid_ddd[i];
			++n;
			if (i < 4) {
				++ncardinal;
			}
		}
	}
	/* Prefer a cardinal direction if available. */
	if (n > 1 && ncardinal > 0) {
		n = ncardinal;
	}
	return (n == 0) ? loc(0, 0) : choices[randint0(n)];
}